

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_curves.cpp
# Opt level: O0

void __thiscall
agg::curve4_div::bezier
          (curve4_div *this,double x1,double y1,double x2,double y2,double x3,double y3,double x4,
          double y4)

{
  point_base<double> local_70;
  point_base<double> local_60;
  double local_50;
  double y4_local;
  double x4_local;
  double y3_local;
  double x3_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  curve4_div *this_local;
  
  local_50 = y4;
  y4_local = x4;
  x4_local = y3;
  y3_local = x3;
  x3_local = y2;
  y2_local = x2;
  x2_local = y1;
  y1_local = x1;
  x1_local = (double)this;
  point_base<double>::point_base(&local_60,x1,y1);
  pod_bvector<agg::point_base<double>,_6U>::add
            ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_60);
  recursive_bezier(this,y1_local,x2_local,y2_local,x3_local,y3_local,x4_local,y4_local,local_50,0);
  point_base<double>::point_base(&local_70,y4_local,local_50);
  pod_bvector<agg::point_base<double>,_6U>::add
            ((pod_bvector<agg::point_base<double>,_6U> *)(this + 0x28),&local_70);
  return;
}

Assistant:

void curve4_div::bezier(double x1, double y1, 
                            double x2, double y2, 
                            double x3, double y3, 
                            double x4, double y4)
    {
        m_points.add(point_d(x1, y1));
        recursive_bezier(x1, y1, x2, y2, x3, y3, x4, y4, 0);
        m_points.add(point_d(x4, y4));
    }